

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadStringFallback
          (CodedInputStream *this,string *buffer,int size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int in_EDX;
  char *in_RSI;
  CodedInputStream *in_RDI;
  int current_buffer_size;
  int bytes_to_limit;
  int closest_limit;
  CodedInputStream *in_stack_00000098;
  int local_1c;
  
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::clear();
  }
  piVar5 = std::min<int>(&in_RDI->current_limit_,&in_RDI->total_bytes_limit_);
  iVar3 = *piVar5;
  local_1c = in_EDX;
  if (iVar3 != 0x7fffffff) {
    iVar2 = CurrentPosition(in_RDI);
    iVar3 = iVar3 - iVar2;
    if (((0 < iVar3) && (0 < in_EDX)) && (in_EDX <= iVar3)) {
      std::__cxx11::string::reserve((ulong)in_RSI);
    }
  }
  do {
    iVar3 = BufferSize(in_RDI);
    if (local_1c <= iVar3) {
      std::__cxx11::string::append(in_RSI,(ulong)in_RDI->buffer_);
      Advance(in_RDI,local_1c);
      return true;
    }
    if (iVar3 != 0) {
      std::__cxx11::string::append(in_RSI,(ulong)in_RDI->buffer_);
    }
    local_1c = local_1c - iVar3;
    Advance(in_RDI,iVar3);
    bVar1 = Refresh(in_stack_00000098);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadStringFallback(std::string* buffer, int size) {
  if (!buffer->empty()) {
    buffer->clear();
  }

  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  if (closest_limit != INT_MAX) {
    int bytes_to_limit = closest_limit - CurrentPosition();
    if (bytes_to_limit > 0 && size > 0 && size <= bytes_to_limit) {
      buffer->reserve(size);
    }
  }

  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Some STL implementations "helpfully" crash on buffer->append(NULL, 0).
    if (current_buffer_size != 0) {
      // Note:  string1.append(string2) is O(string2.size()) (as opposed to
      //   O(string1.size() + string2.size()), which would be bad).
      buffer->append(reinterpret_cast<const char*>(buffer_),
                     current_buffer_size);
    }
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  buffer->append(reinterpret_cast<const char*>(buffer_), size);
  Advance(size);

  return true;
}